

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

double xmlXPathStringEvalNumber(xmlChar *str)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  double dVar4;
  int iVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  byte *pbVar14;
  xmlChar *cur;
  double dVar15;
  double dVar16;
  
  if (str == (xmlChar *)0x0) {
    return 0.0;
  }
  while( true ) {
    bVar3 = *str;
    uVar9 = (ulong)bVar3;
    if (0x2e < uVar9) break;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 == 0x2e) goto LAB_001deb67;
      break;
    }
    str = str + 1;
  }
  if (bVar3 != 0x2d && 9 < (byte)(bVar3 - 0x30)) {
    return NAN;
  }
LAB_001deb67:
  uVar11 = (ulong)(bVar3 == 0x2d);
  uVar9 = (ulong)str[uVar11];
  bVar12 = str[uVar11] - 0x30;
  if (bVar12 < 10) {
    dVar4 = 0.0;
    do {
      dVar4 = (double)((byte)uVar9 & 0xf) + dVar4 * 10.0;
      lVar7 = uVar11 + 1;
      uVar9 = (ulong)str[lVar7];
      uVar11 = uVar11 + 1;
    } while ((byte)(str[lVar7] - 0x30) < 10);
  }
  else {
    dVar4 = 0.0;
  }
  pbVar14 = str + uVar11;
  if ((char)uVar9 != '.') goto LAB_001dec86;
  bVar10 = pbVar14[1];
  pbVar14 = pbVar14 + 1;
  if (bVar10 < 0x30) {
    if (9 < bVar12) {
      return NAN;
    }
LAB_001dec00:
    uVar8 = 0;
  }
  else {
    if ((9 < bVar12) && (0x39 < bVar10)) {
      return NAN;
    }
    if (bVar10 != 0x30) goto LAB_001dec00;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + 1;
      bVar10 = pbVar14[1];
      pbVar14 = pbVar14 + 1;
    } while (bVar10 == 0x30);
  }
  dVar16 = 0.0;
  if ((byte)(bVar10 - 0x30) < 10) {
    uVar1 = uVar8 + 0x14;
    do {
      dVar16 = dVar16 * 10.0 + (double)(int)(bVar10 - 0x30);
      uVar8 = uVar8 + 1;
      bVar10 = pbVar14[1];
      pbVar14 = pbVar14 + 1;
      if (9 < (byte)(bVar10 - 0x30)) break;
    } while (uVar8 < uVar1);
  }
  dVar15 = pow(10.0,(double)(int)uVar8);
  pbVar14 = pbVar14 + -1;
  do {
    pbVar2 = pbVar14 + 1;
    uVar9 = (ulong)*pbVar2;
    pbVar14 = pbVar14 + 1;
  } while ((byte)(*pbVar2 - 0x30) < 10);
  dVar4 = dVar4 + dVar16 / dVar15;
LAB_001dec86:
  if (((uint)uVar9 | 0x20) == 0x65) {
    bVar6 = false;
    if (pbVar14[1] == 0x2b) {
      pbVar14 = pbVar14 + 2;
    }
    else if (pbVar14[1] == 0x2d) {
      pbVar14 = pbVar14 + 2;
      bVar6 = true;
    }
    else {
      pbVar14 = pbVar14 + 1;
    }
    uVar9 = (ulong)*pbVar14;
    if ((byte)(*pbVar14 - 0x30) < 10) {
      iVar13 = 0;
      do {
        iVar5 = (int)uVar9 + -0x30 + iVar13 * 10;
        if (999999 < iVar13) {
          iVar5 = iVar13;
        }
        iVar13 = iVar5;
        pbVar2 = pbVar14 + 1;
        uVar9 = (ulong)*pbVar2;
        pbVar14 = pbVar14 + 1;
      } while ((byte)(*pbVar2 - 0x30) < 10);
    }
    else {
      iVar13 = 0;
    }
  }
  else {
    iVar13 = 0;
    bVar6 = false;
  }
  while( true ) {
    pbVar14 = pbVar14 + 1;
    if (0x20 < (byte)uVar9) {
      return NAN;
    }
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) break;
    uVar9 = (ulong)*pbVar14;
  }
  if (uVar9 != 0) {
    return NAN;
  }
  if (bVar3 == 0x2d) {
    dVar4 = -dVar4;
  }
  iVar5 = -iVar13;
  if (!bVar6) {
    iVar5 = iVar13;
  }
  dVar16 = pow(10.0,(double)iVar5);
  return dVar16 * dVar4;
}

Assistant:

double
xmlXPathStringEvalNumber(const xmlChar *str) {
    const xmlChar *cur = str;
    double ret;
    int ok = 0;
    int isneg = 0;
    int exponent = 0;
    int is_exponent_negative = 0;
#ifdef __GNUC__
    unsigned long tmp = 0;
    double temp;
#endif
    if (cur == NULL) return(0);
    while (IS_BLANK_CH(*cur)) cur++;
    if ((*cur != '.') && ((*cur < '0') || (*cur > '9')) && (*cur != '-')) {
        return(NAN);
    }
    if (*cur == '-') {
	isneg = 1;
	cur++;
    }

#ifdef __GNUC__
    /*
     * tmp/temp is a workaround against a gcc compiler bug
     * http://veillard.com/gcc.bug
     */
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10;
	tmp = (*cur - '0');
	ok = 1;
	cur++;
	temp = (double) tmp;
	ret = ret + temp;
    }
#else
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10 + (*cur - '0');
	ok = 1;
	cur++;
    }
#endif

    if (*cur == '.') {
	int v, frac = 0, max;
	double fraction = 0;

        cur++;
	if (((*cur < '0') || (*cur > '9')) && (!ok)) {
	    return(NAN);
	}
        while (*cur == '0') {
	    frac = frac + 1;
	    cur++;
        }
        max = frac + MAX_FRAC;
	while (((*cur >= '0') && (*cur <= '9')) && (frac < max)) {
	    v = (*cur - '0');
	    fraction = fraction * 10 + v;
	    frac = frac + 1;
	    cur++;
	}
	fraction /= pow(10.0, frac);
	ret = ret + fraction;
	while ((*cur >= '0') && (*cur <= '9'))
	    cur++;
    }
    if ((*cur == 'e') || (*cur == 'E')) {
      cur++;
      if (*cur == '-') {
	is_exponent_negative = 1;
	cur++;
      } else if (*cur == '+') {
        cur++;
      }
      while ((*cur >= '0') && (*cur <= '9')) {
        if (exponent < 1000000)
	  exponent = exponent * 10 + (*cur - '0');
	cur++;
      }
    }
    while (IS_BLANK_CH(*cur)) cur++;
    if (*cur != 0) return(NAN);
    if (isneg) ret = -ret;
    if (is_exponent_negative) exponent = -exponent;
    ret *= pow(10.0, (double)exponent);
    return(ret);
}